

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M3DImporter.cpp
# Opt level: O1

void __thiscall
Assimp::M3DImporter::populateMesh
          (M3DImporter *this,M3DWrapper *m3d,aiMesh *pMesh,
          vector<aiFace,_std::allocator<aiFace>_> *faces,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *vertices,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *normals,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *texcoords,
          vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *colors,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *vertexids)

{
  uint uVar1;
  pointer paVar2;
  pointer __src;
  m3ds_t *pmVar3;
  long *plVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ulong *puVar8;
  aiFace *paVar9;
  long lVar10;
  aiVector3D *paVar11;
  aiColor4D *__s;
  aiBone **ppaVar12;
  aiBone *paVar13;
  aiNode *paVar14;
  aiVertexWeight *__s_00;
  pointer puVar15;
  M3DWrapper *pMVar16;
  uint k_1;
  uint uVar17;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar18;
  M3DImporter *pMVar19;
  aiBone *pBone;
  pointer o;
  aiMesh *paVar20;
  uint k;
  aiFace *this_00;
  ulong uVar21;
  size_t sVar22;
  aiString name;
  allocator<char> local_881;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_880;
  aiMesh *local_878;
  M3DImporter *local_870;
  M3DWrapper *local_868;
  long *local_860;
  ulong local_858;
  long local_850 [2];
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_840;
  undefined1 local_838 [1028];
  aiString local_434;
  
  local_880 = normals;
  local_870 = this;
  if (pMesh == (aiMesh *)0x0) {
    __assert_fail("pMesh != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x29c,
                  "void Assimp::M3DImporter::populateMesh(const M3DWrapper &, aiMesh *, std::vector<aiFace> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiColor4D> *, std::vector<unsigned int> *)"
                 );
  }
  if (faces == (vector<aiFace,_std::allocator<aiFace>_> *)0x0) {
    __assert_fail("faces != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x29d,
                  "void Assimp::M3DImporter::populateMesh(const M3DWrapper &, aiMesh *, std::vector<aiFace> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiColor4D> *, std::vector<unsigned int> *)"
                 );
  }
  if (vertices == (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0) {
    __assert_fail("vertices != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x29e,
                  "void Assimp::M3DImporter::populateMesh(const M3DWrapper &, aiMesh *, std::vector<aiFace> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiColor4D> *, std::vector<unsigned int> *)"
                 );
  }
  if (normals == (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0) {
    __assert_fail("normals != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x29f,
                  "void Assimp::M3DImporter::populateMesh(const M3DWrapper &, aiMesh *, std::vector<aiFace> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiColor4D> *, std::vector<unsigned int> *)"
                 );
  }
  if (texcoords == (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0) {
    __assert_fail("texcoords != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x2a0,
                  "void Assimp::M3DImporter::populateMesh(const M3DWrapper &, aiMesh *, std::vector<aiFace> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiColor4D> *, std::vector<unsigned int> *)"
                 );
  }
  if (colors == (vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)0x0) {
    __assert_fail("colors != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x2a1,
                  "void Assimp::M3DImporter::populateMesh(const M3DWrapper &, aiMesh *, std::vector<aiFace> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiColor4D> *, std::vector<unsigned int> *)"
                 );
  }
  if (vertexids == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    __assert_fail("vertexids != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x2a2,
                  "void Assimp::M3DImporter::populateMesh(const M3DWrapper &, aiMesh *, std::vector<aiFace> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiColor4D> *, std::vector<unsigned int> *)"
                 );
  }
  if (m3d->m3d_ == (m3d_t *)0x0) {
    __assert_fail("m3d",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x2a3,
                  "void Assimp::M3DImporter::populateMesh(const M3DWrapper &, aiMesh *, std::vector<aiFace> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiColor4D> *, std::vector<unsigned int> *)"
                 );
  }
  local_878 = (aiMesh *)DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[31]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_838,
             (char (*) [31])"M3D: populateMesh numvertices ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_838);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_838," numfaces ",10);
  std::ostream::_M_insert<unsigned_long>((ulong)local_838);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_838," numnormals ",0xc);
  std::ostream::_M_insert<unsigned_long>((ulong)local_838);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_838," numtexcoord ",0xd);
  std::ostream::_M_insert<unsigned_long>((ulong)local_838);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_838," numbones ",10);
  std::ostream::_M_insert<unsigned_long>((ulong)local_838);
  std::__cxx11::stringbuf::str();
  Logger::debug((Logger *)local_878,(char *)local_860);
  if (local_860 != local_850) {
    operator_delete(local_860,local_850[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_838);
  std::ios_base::~ios_base((ios_base *)(local_838 + 0x70));
  if (((vertices->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish !=
       (vertices->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_start) &&
     (lVar6 = (long)(faces->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(faces->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.
                    super__Vector_impl_data._M_start, lVar6 != 0)) {
    uVar7 = lVar6 >> 4;
    pMesh->mNumFaces = (uint)uVar7;
    uVar7 = uVar7 & 0xffffffff;
    local_878 = pMesh;
    local_868 = m3d;
    local_840 = vertices;
    puVar8 = (ulong *)operator_new__(uVar7 * 0x10 + 8);
    *puVar8 = uVar7;
    this_00 = (aiFace *)(puVar8 + 1);
    if (uVar7 != 0) {
      paVar9 = this_00;
      do {
        paVar9->mNumIndices = 0;
        paVar9->mIndices = (uint *)0x0;
        paVar9 = paVar9 + 1;
      } while (paVar9 != this_00 + uVar7);
    }
    local_878->mFaces = this_00;
    o = (faces->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.super__Vector_impl_data
        ._M_start;
    lVar6 = (long)(faces->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)o >> 4;
    if (0 < lVar6) {
      lVar6 = lVar6 + 1;
      do {
        aiFace::operator=(this_00,o);
        o = o + 1;
        this_00 = this_00 + 1;
        lVar6 = lVar6 + -1;
      } while (1 < lVar6);
    }
    paVar20 = local_878;
    lVar10 = (long)(local_840->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(local_840->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start;
    lVar6 = lVar10 >> 0x3f;
    uVar7 = (lVar10 / 6 + lVar6 >> 1) - lVar6;
    uVar17 = (uint)uVar7;
    local_878->mNumVertices = uVar17;
    uVar21 = uVar7 & 0xffffffff;
    paVar11 = (aiVector3D *)operator_new__(uVar21 * 0xc);
    if (uVar21 != 0) {
      memset(paVar11,0,((uVar21 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar20->mVertices = paVar11;
    paVar2 = (local_840->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    sVar22 = (long)(local_840->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)paVar2;
    if (sVar22 != 0) {
      memmove(paVar11,paVar2,sVar22);
    }
    if ((long)(local_880->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(local_880->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
              )._M_impl.super__Vector_impl_data._M_start == sVar22) {
      paVar11 = (aiVector3D *)operator_new__((uVar7 & 0xffffffff) * 0xc);
      if (uVar17 != 0) {
        memset(paVar11,0,((uVar21 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      paVar20->mNormals = paVar11;
      paVar2 = (local_880->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar22 = (long)(local_880->
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)paVar2;
      if (sVar22 != 0) {
        memmove(paVar11,paVar2,sVar22);
      }
    }
    if ((long)(texcoords->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(texcoords->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
              )._M_impl.super__Vector_impl_data._M_start ==
        (long)(local_840->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(local_840->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
              )._M_impl.super__Vector_impl_data._M_start) {
      paVar11 = (aiVector3D *)operator_new__((uVar7 & 0xffffffff) * 0xc);
      if (uVar17 != 0) {
        memset(paVar11,0,((uVar21 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      paVar20->mTextureCoords[0] = paVar11;
      paVar2 = (texcoords->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar22 = (long)(texcoords->
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)paVar2;
      if (sVar22 != 0) {
        memmove(paVar11,paVar2,sVar22);
      }
      paVar20->mNumUVComponents[0] = 2;
    }
    if ((long)(colors->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(colors->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_start >> 4 ==
        ((long)(local_840->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(local_840->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_start >> 2) * -0x5555555555555555) {
      __s = (aiColor4D *)operator_new__((uVar7 & 0xffffffff) << 4);
      if (uVar17 != 0) {
        memset(__s,0,uVar21 << 4);
      }
      paVar20->mColors[0] = __s;
      __src = (colors->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
      sVar22 = (long)(colors->
                     super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)__src;
      if (sVar22 != 0) {
        memmove(__s,__src,sVar22);
      }
    }
    pMVar16 = local_868;
    uVar17 = local_868->m3d_->numbone;
    paVar20->mNumBones = uVar17;
    if ((ulong)uVar17 != 0) {
      ppaVar12 = (aiBone **)operator_new__((ulong)uVar17 << 3);
      paVar20->mBones = ppaVar12;
      if (pMVar16->m3d_->numbone != 0) {
        pvVar18 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x1;
        uVar7 = 0;
        do {
          paVar13 = (aiBone *)operator_new(0x460);
          (paVar13->mName).length = 0;
          (paVar13->mName).data[0] = '\0';
          memset((paVar13->mName).data + 1,0x1b,0x3ff);
          paVar13->mNumWeights = 0;
          paVar13->mWeights = (aiVertexWeight *)0x0;
          (paVar13->mOffsetMatrix).a1 = 1.0;
          (paVar13->mOffsetMatrix).a2 = 0.0;
          (paVar13->mOffsetMatrix).a3 = 0.0;
          (paVar13->mOffsetMatrix).a4 = 0.0;
          (paVar13->mOffsetMatrix).b1 = 0.0;
          (paVar13->mOffsetMatrix).b2 = 1.0;
          (paVar13->mOffsetMatrix).b3 = 0.0;
          (paVar13->mOffsetMatrix).b4 = 0.0;
          (paVar13->mOffsetMatrix).c1 = 0.0;
          (paVar13->mOffsetMatrix).c2 = 0.0;
          (paVar13->mOffsetMatrix).c3 = 1.0;
          (paVar13->mOffsetMatrix).c4 = 0.0;
          (paVar13->mOffsetMatrix).d1 = 0.0;
          (paVar13->mOffsetMatrix).d2 = 0.0;
          (paVar13->mOffsetMatrix).d3 = 0.0;
          (paVar13->mOffsetMatrix).d4 = 1.0;
          paVar20->mBones[uVar7] = paVar13;
          local_880 = pvVar18;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_860,
                     *(char **)(pMVar16->m3d_->bone->mat4 + (long)pvVar18 * 2 + -10),&local_881);
          sVar22 = local_858 & 0xffffffff;
          if ((local_858 & 0xfffffc00) != 0) {
            sVar22 = 0x3ff;
          }
          local_838._0_4_ = (uint)sVar22;
          memcpy(local_838 + 4,local_860,sVar22);
          local_838[sVar22 + 4] = 0;
          paVar13 = paVar20->mBones[uVar7];
          (paVar13->mName).length = (uint)sVar22;
          memcpy((paVar13->mName).data,local_838 + 4,sVar22);
          (paVar13->mName).data[sVar22] = '\0';
          if (local_860 != local_850) {
            operator_delete(local_860,local_850[0] + 1);
          }
          pMVar19 = local_870;
          paVar20->mBones[uVar7]->mNumWeights = 0;
          paVar14 = local_870->mScene->mRootNode;
          local_434.length = (paVar20->mBones[uVar7]->mName).length;
          if (0x3fe < local_434.length) {
            local_434.length = 0x3ff;
          }
          uVar21 = (ulong)local_434.length;
          memcpy(local_434.data,(paVar20->mBones[uVar7]->mName).data,uVar21);
          paVar20 = local_878;
          local_434.data[uVar21] = '\0';
          paVar14 = findNode(pMVar19,paVar14,&local_434);
          paVar13 = paVar20->mBones[uVar7];
          if (paVar14 == (aiNode *)0x0) {
            (paVar13->mOffsetMatrix).a1 = 1.0;
            (paVar13->mOffsetMatrix).a2 = 0.0;
            (paVar13->mOffsetMatrix).a3 = 0.0;
            (paVar13->mOffsetMatrix).a4 = 0.0;
            (paVar13->mOffsetMatrix).b1 = 0.0;
            (paVar13->mOffsetMatrix).b2 = 1.0;
            (paVar13->mOffsetMatrix).b3 = 0.0;
            (paVar13->mOffsetMatrix).b4 = 0.0;
            (paVar13->mOffsetMatrix).c1 = 0.0;
            (paVar13->mOffsetMatrix).c2 = 0.0;
            (paVar13->mOffsetMatrix).c3 = 1.0;
            (paVar13->mOffsetMatrix).c4 = 0.0;
            (paVar13->mOffsetMatrix).d1 = 0.0;
            (paVar13->mOffsetMatrix).d2 = 0.0;
            (paVar13->mOffsetMatrix).d3 = 0.0;
            (paVar13->mOffsetMatrix).d4 = 1.0;
          }
          else {
            calculateOffsetMatrix(pMVar19,paVar14,&paVar13->mOffsetMatrix);
            aiMatrix4x4t<float>::Inverse(&paVar20->mBones[uVar7]->mOffsetMatrix);
          }
          uVar7 = uVar7 + 1;
          pvVar18 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                    ((long)&(local_880->
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish + 5);
          pMVar16 = local_868;
        } while (uVar7 < local_868->m3d_->numbone);
      }
      if ((vertexids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish !=
          (vertexids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start) {
        puVar15 = (vertexids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        if ((vertexids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish != puVar15) {
          pMVar19 = (M3DImporter *)0x0;
          do {
            uVar17 = pMVar16->m3d_->vertex[puVar15[(long)pMVar19]].skinid;
            local_880 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                        (ulong)uVar17;
            local_870 = pMVar19;
            if (uVar17 >> 1 < 0x7fffffff) {
              local_880 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                          ((long)local_880 << 5);
              lVar6 = 0;
              do {
                pmVar3 = pMVar16->m3d_->skin;
                if (*(float *)((long)&(local_880->
                                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start +
                              (long)(pmVar3->weight + lVar6)) <= 0.0) break;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_860,
                           pMVar16->m3d_->bone
                           [*(uint *)((long)&(local_880->
                                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start +
                                     (long)(pmVar3->boneid + lVar6))].name,&local_881);
                plVar4 = local_860;
                sVar22 = local_858 & 0xffffffff;
                if ((local_858 & 0xfffffc00) != 0) {
                  sVar22 = 0x3ff;
                }
                local_838._0_4_ = (uint)sVar22;
                memcpy(local_838 + 4,local_860,sVar22);
                local_838[sVar22 + 4] = 0;
                if (plVar4 != local_850) {
                  operator_delete(plVar4,local_850[0] + 1);
                }
                uVar17 = local_878->mNumBones;
                if ((ulong)uVar17 != 0) {
                  ppaVar12 = local_878->mBones;
                  uVar7 = 0;
                  do {
                    paVar13 = ppaVar12[uVar7];
                    uVar1 = (paVar13->mName).length;
                    if ((uVar1 == (uint)sVar22) &&
                       (iVar5 = bcmp((paVar13->mName).data,local_838 + 4,(ulong)uVar1), iVar5 == 0))
                    {
                      paVar13->mNumWeights = paVar13->mNumWeights + 1;
                      break;
                    }
                    uVar7 = uVar7 + 1;
                  } while (uVar17 != uVar7);
                }
                lVar6 = lVar6 + 1;
                pMVar16 = local_868;
              } while (lVar6 != 4);
            }
            pMVar19 = (M3DImporter *)(ulong)((int)local_870 + 1);
            puVar15 = (vertexids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start;
          } while (pMVar19 < (M3DImporter *)
                             ((long)(vertexids->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar15 >> 2)
                  );
        }
        paVar20 = local_878;
        if (local_878->mNumBones != 0) {
          uVar7 = 0;
          do {
            paVar13 = paVar20->mBones[uVar7];
            if ((ulong)paVar13->mNumWeights != 0) {
              uVar21 = (ulong)paVar13->mNumWeights << 3;
              __s_00 = (aiVertexWeight *)operator_new__(uVar21);
              memset(__s_00,0,uVar21);
              paVar13->mWeights = __s_00;
              paVar13->mNumWeights = 0;
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 < paVar20->mNumBones);
        }
        puVar15 = (vertexids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        if ((vertexids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish != puVar15) {
          local_870 = (M3DImporter *)0x0;
          pMVar16 = local_868;
          do {
            uVar17 = pMVar16->m3d_->vertex[puVar15[(long)local_870]].skinid;
            if (uVar17 >> 1 < 0x7fffffff) {
              local_880 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                          ((ulong)uVar17 << 5);
              lVar6 = 0;
              do {
                pmVar3 = pMVar16->m3d_->skin;
                if (*(float *)((long)pmVar3->weight + lVar6 * 4 + (long)local_880) <= 0.0) break;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_860,
                           pMVar16->m3d_->bone
                           [*(uint *)((long)pmVar3->boneid + lVar6 * 4 + (long)local_880)].name,
                           &local_881);
                plVar4 = local_860;
                sVar22 = local_858 & 0xffffffff;
                if ((local_858 & 0xfffffc00) != 0) {
                  sVar22 = 0x3ff;
                }
                local_838._0_4_ = (uint)sVar22;
                memcpy(local_838 + 4,local_860,sVar22);
                local_838[sVar22 + 4] = 0;
                if (plVar4 != local_850) {
                  operator_delete(plVar4,local_850[0] + 1);
                }
                uVar17 = paVar20->mNumBones;
                if ((ulong)uVar17 != 0) {
                  ppaVar12 = local_878->mBones;
                  uVar7 = 0;
                  do {
                    paVar13 = ppaVar12[uVar7];
                    uVar1 = (paVar13->mName).length;
                    if ((uVar1 == (uint)sVar22) &&
                       (iVar5 = bcmp((paVar13->mName).data,local_838 + 4,(ulong)uVar1), iVar5 == 0))
                    {
                      paVar13->mWeights[paVar13->mNumWeights].mVertexId = (uint)local_870;
                      paVar13->mWeights[paVar13->mNumWeights].mWeight =
                           *(float *)((long)local_868->m3d_->skin->weight +
                                     lVar6 * 4 + (long)local_880);
                      paVar13->mNumWeights = paVar13->mNumWeights + 1;
                      break;
                    }
                    uVar7 = uVar7 + 1;
                  } while (uVar17 != uVar7);
                }
                lVar6 = lVar6 + 1;
                pMVar16 = local_868;
                paVar20 = local_878;
              } while (lVar6 != 4);
            }
            local_870 = (M3DImporter *)(ulong)((int)local_870 + 1);
            puVar15 = (vertexids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start;
          } while (local_870 <
                   (ulong)((long)(vertexids->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar15 >> 2));
        }
      }
    }
  }
  return;
}

Assistant:

void M3DImporter::populateMesh(const M3DWrapper &m3d, aiMesh *pMesh, std::vector<aiFace> *faces, std::vector<aiVector3D> *vertices,
		std::vector<aiVector3D> *normals, std::vector<aiVector3D> *texcoords, std::vector<aiColor4D> *colors,
		std::vector<unsigned int> *vertexids) {

	ai_assert(pMesh != nullptr);
	ai_assert(faces != nullptr);
	ai_assert(vertices != nullptr);
	ai_assert(normals != nullptr);
	ai_assert(texcoords != nullptr);
	ai_assert(colors != nullptr);
	ai_assert(vertexids != nullptr);
	ai_assert(m3d);

	ASSIMP_LOG_DEBUG_F("M3D: populateMesh numvertices ", vertices->size(), " numfaces ", faces->size(),
			" numnormals ", normals->size(), " numtexcoord ", texcoords->size(), " numbones ", m3d->numbone);

	if (vertices->size() && faces->size()) {
		pMesh->mNumFaces = static_cast<unsigned int>(faces->size());
		pMesh->mFaces = new aiFace[pMesh->mNumFaces];
		std::copy(faces->begin(), faces->end(), pMesh->mFaces);
		pMesh->mNumVertices = static_cast<unsigned int>(vertices->size());
		pMesh->mVertices = new aiVector3D[pMesh->mNumVertices];
		std::copy(vertices->begin(), vertices->end(), pMesh->mVertices);
		if (normals->size() == vertices->size()) {
			pMesh->mNormals = new aiVector3D[pMesh->mNumVertices];
			std::copy(normals->begin(), normals->end(), pMesh->mNormals);
		}
		if (texcoords->size() == vertices->size()) {
			pMesh->mTextureCoords[0] = new aiVector3D[pMesh->mNumVertices];
			std::copy(texcoords->begin(), texcoords->end(), pMesh->mTextureCoords[0]);
			pMesh->mNumUVComponents[0] = 2;
		}
		if (colors->size() == vertices->size()) {
			pMesh->mColors[0] = new aiColor4D[pMesh->mNumVertices];
			std::copy(colors->begin(), colors->end(), pMesh->mColors[0]);
		}
		// this is complicated, because M3D stores a list of bone id / weight pairs per
		// vertex but assimp uses lists of local vertex id/weight pairs per local bone list
		pMesh->mNumBones = m3d->numbone;
		/* we need aiBone with mOffsetMatrix for bones without weights as well */
		if (pMesh->mNumBones) {
			pMesh->mBones = new aiBone *[pMesh->mNumBones];
			for (unsigned int i = 0; i < m3d->numbone; i++) {
				aiNode *pNode;
				pMesh->mBones[i] = new aiBone;
				pMesh->mBones[i]->mName = aiString(std::string(m3d->bone[i].name));
				pMesh->mBones[i]->mNumWeights = 0;
				pNode = findNode(mScene->mRootNode, pMesh->mBones[i]->mName);
				if (pNode) {
					calculateOffsetMatrix(pNode, &pMesh->mBones[i]->mOffsetMatrix);
					pMesh->mBones[i]->mOffsetMatrix.Inverse();
				} else
					pMesh->mBones[i]->mOffsetMatrix = aiMatrix4x4();
			}
			if (vertexids->size()) {
				unsigned int i, j;
				// first count how many vertices we have per bone
				for (i = 0; i < vertexids->size(); i++) {
					unsigned int s = m3d->vertex[vertexids->at(i)].skinid;
					if (s != M3D_UNDEF && s != M3D_INDEXMAX) {
						for (unsigned int k = 0; k < M3D_NUMBONE && m3d->skin[s].weight[k] > 0.0; k++) {
							aiString name = aiString(std::string(m3d->bone[m3d->skin[s].boneid[k]].name));
							for (j = 0; j < pMesh->mNumBones; j++) {
								if (pMesh->mBones[j]->mName == name) {
									pMesh->mBones[j]->mNumWeights++;
									break;
								}
							}
						}
					}
				}
				// allocate mWeights
				for (j = 0; j < pMesh->mNumBones; j++) {
					aiBone *pBone = pMesh->mBones[j];
					if (pBone->mNumWeights) {
						pBone->mWeights = new aiVertexWeight[pBone->mNumWeights];
						pBone->mNumWeights = 0;
					}
				}
				// fill up with data
				for (i = 0; i < vertexids->size(); i++) {
					unsigned int s = m3d->vertex[vertexids->at(i)].skinid;
					if (s != M3D_UNDEF && s != M3D_INDEXMAX) {
						for (unsigned int k = 0; k < M3D_NUMBONE && m3d->skin[s].weight[k] > 0.0; k++) {
							aiString name = aiString(std::string(m3d->bone[m3d->skin[s].boneid[k]].name));
							for (j = 0; j < pMesh->mNumBones; j++) {
								if (pMesh->mBones[j]->mName == name) {
									aiBone *pBone = pMesh->mBones[j];
									pBone->mWeights[pBone->mNumWeights].mVertexId = i;
									pBone->mWeights[pBone->mNumWeights].mWeight = m3d->skin[s].weight[k];
									pBone->mNumWeights++;
									break;
								}
							}
						} // foreach skin
					}
				} // foreach vertexids
			}
		}
	}
}